

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void modify_account(int n)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  Account account;
  fstream File;
  Account local_260;
  long local_240 [2];
  char local_230 [16];
  byte abStack_220 [496];
  
  local_260._vptr_Account = (_func_int **)&PTR_create_account_00107c80;
  std::fstream::fstream(local_240);
  std::fstream::open((char *)local_240,0x10513d);
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
    bVar1 = false;
    bVar5 = true;
    while( true ) {
      plVar2 = (long *)std::istream::read((char *)local_240,(long)&local_260);
      if ((*(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0 || bVar1) break;
      bVar1 = false;
      bVar5 = local_260.account_number != n;
      if (!bVar5) {
        Account::show_account(&local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n\n==>>Enter The New Details of Account",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        Account::modify_account(&local_260);
        std::ostream::seekp((long)local_230,0xffffffe0);
        std::ostream::write(local_230,(long)&local_260);
        bVar1 = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Record Updated..\n\n     \t\t\t\t\t                     ==>>Press Enter<<=="
                   ,0x71);
      }
    }
    std::fstream::close();
    if (!bVar5) goto LAB_00104291;
    lVar3 = 0x14;
    pcVar4 = "\n\n Record Not Found ";
  }
  else {
    lVar3 = 0x2a;
    pcVar4 = "File could not be open !! Press any Key...";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
LAB_00104291:
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void modify_account(int n)
{
    /*!
     * It modifies account with account number (n) regarding to the values entered
     * by the user
     */
    int found=0;
    Account account;
    std::fstream File;
    File.open("Account.dat",std::ios::binary|std::ios::in|std::ios::out);
    if(!File)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    while(File.read((char *) &account, sizeof(Account)) && found==0)
    {
        if(account.return_account_num()==n)
        {
            account.show_account();
            std::cout<<"\n\n==>>Enter The New Details of Account"<<std::endl;
            account.modify_account();
            int pos=(-1)*sizeof(Account);
            File.seekp(pos,std::ios::cur);
            File.write((char *) &account, sizeof(Account));
            std::cout<<"\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Record Updated..\n\n     \t\t\t\t\t                     ==>>Press Enter<<==";
            found=1;
        }
    }
    File.close();
    if(found==0)
        std::cout<<"\n\n Record Not Found ";
}